

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

void __thiscall MIDIStreamer::StartPlayback(MIDIStreamer *this)

{
  DWORD DVar1;
  bool bVar2;
  int iVar3;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x1a])();
  this->LoopLimit = 0;
  iVar3 = (*this->MIDI->_vptr_MIDIDevice[7])(this->MIDI,(ulong)(uint)this->Division);
  if (iVar3 == 0) {
    this->Tempo = this->InitialTempo;
    iVar3 = (*this->MIDI->_vptr_MIDIDevice[6])();
    if (iVar3 == 0) {
      (*(this->super_MusInfo)._vptr_MusInfo[2])(this);
      if (this->MIDI != (MIDIDevice *)0x0) {
        DVar1 = this->Volume;
        iVar3 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
        if ((char)iVar3 != '\0') {
          this->NewVolume = DVar1;
          this->VolumeChanged = true;
        }
      }
      this->BufferNum = 0;
      do {
        iVar3 = FillBuffer(this,this->BufferNum,0x80,100000);
        if ((iVar3 == 1) || (iVar3 != 0)) {
LAB_0033b8fb:
          (*(this->super_MusInfo)._vptr_MusInfo[7])(this);
          bVar2 = true;
        }
        else {
          iVar3 = (*this->MIDI->_vptr_MIDIDevice[9])(this->MIDI,this->Buffer + this->BufferNum);
          if (iVar3 != 0) {
            Printf("Initial midiStreamOut failed\n");
            goto LAB_0033b8fb;
          }
          *(byte *)&this->BufferNum = (byte)this->BufferNum ^ 1;
          bVar2 = false;
        }
        if ((bVar2) || (this->BufferNum == 0)) {
          return;
        }
      } while( true );
    }
  }
  Printf(200,"Setting MIDI stream speed failed\n");
  (*this->MIDI->_vptr_MIDIDevice[3])();
  return;
}

Assistant:

void MIDIStreamer::StartPlayback()
{
	Precache();
	LoopLimit = 0;

	// Set time division and tempo.
	if (0 != MIDI->SetTimeDiv(Division) ||
		0 != MIDI->SetTempo(Tempo = InitialTempo))
	{
		Printf(PRINT_BOLD, "Setting MIDI stream speed failed\n");
		MIDI->Close();
		return;
	}

	MusicVolumeChanged();	// set volume to current music's properties
	OutputVolume(Volume);

#ifdef _WIN32
	ResetEvent(ExitEvent);
	ResetEvent(BufferDoneEvent);
#endif

	// Fill the initial buffers for the song.
	BufferNum = 0;
	do
	{
		int res = FillBuffer(BufferNum, MAX_EVENTS, MAX_TIME);
		if (res == SONG_MORE)
		{
			if (0 != MIDI->StreamOutSync(&Buffer[BufferNum]))
			{
				Printf ("Initial midiStreamOut failed\n");
				Stop();
				return;
			}
			BufferNum ^= 1;
		}
		else if (res == SONG_DONE)
		{
			// Do not play super short songs that can't fill the initial two buffers.
			Stop();
			return;
		}
		else
		{
			Stop();
			return;
		}
	}
	while (BufferNum != 0);
}